

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

sstring_view<std::shared_ptr<const_char>_> * __thiscall
pstore::serialize::
read<pstore::sstring_view<std::shared_ptr<char_const>>,pstore::serialize::archive::database_reader>
          (sstring_view<std::shared_ptr<const_char>_> *__return_storage_ptr__,serialize *this,
          database_reader *archive)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  unique_ptr<pstore::sstring_view<std::shared_ptr<const_char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  d;
  type uninit_buffer;
  __uniq_ptr_impl<pstore::sstring_view<std::shared_ptr<const_char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  size_type local_28;
  
  flood<pstore::serialize::details::aligned_storage<24ul,8ul>::type>((type *)&local_38);
  serializer<pstore::sstring_view<std::shared_ptr<char_const>>,void>::
  readsv<pstore::serialize::archive::database_reader&>
            ((database_reader *)this,(value_type *)&local_38);
  _Var2._M_pi = _Stack_30._M_pi;
  peVar1 = local_38;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = (element_type *)0x0;
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  __return_storage_ptr__->size_ = local_28;
  local_40._M_t.
  super__Tuple_impl<0UL,_pstore::sstring_view<std::shared_ptr<const_char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  .super__Head_base<0UL,_pstore::sstring_view<std::shared_ptr<const_char>_>_*,_false>._M_head_impl =
       (tuple<pstore::sstring_view<std::shared_ptr<const_char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
        )(tuple<pstore::sstring_view<std::shared_ptr<const_char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
          )&local_38;
  std::
  unique_ptr<pstore::sstring_view<std::shared_ptr<const_char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/types.hpp:422:25)>
  ::~unique_ptr((unique_ptr<pstore::sstring_view<std::shared_ptr<const_char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                 *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }